

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O2

void __thiscall
OctreeTracer::create_beam_graphics_pipeline(OctreeTracer *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkPipelineShaderStageCreateInfo> __l;
  initializer_list<VkDynamicState> __l_00;
  allocator_type local_2e61;
  undefined1 local_2e60 [24];
  shared_ptr<myvk::ShaderModule> frag_shader_module;
  shared_ptr<myvk::ShaderModule> vert_shader_module;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  VkDynamicState local_2e08 [2];
  undefined1 local_2e00 [24];
  element_type *local_2de8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2de0;
  VkSpecializationInfo *local_2dd8;
  undefined1 auStack_2dd0 [16];
  VertexInputState local_2dc0;
  InputAssemblyState local_2d58;
  VkStructureType local_2d30;
  void *local_2d28;
  undefined8 uStack_2d20;
  bool local_2d18;
  ViewportState local_2d10;
  MultisampleState local_2ca8;
  VkStructureType local_2c70;
  void *local_2c68;
  undefined8 uStack_2c60;
  undefined8 local_2c58;
  undefined8 uStack_2c50;
  undefined1 local_2c48 [32];
  undefined8 local_2c28;
  undefined8 uStack_2c20;
  undefined8 local_2c18;
  undefined8 uStack_2c10;
  bool local_2c08;
  ColorBlendState local_2c00;
  DynamicState local_2ba8;
  uint32_t kOctreeTracerBeamFragSpv [2774];
  
  memcpy(kOctreeTracerBeamFragSpv,&DAT_00214c10,0x2b58);
  vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::ShaderModule::Create((ShaderModule *)local_2e00,device,kQuadVertSpv,0x354);
  std::__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2> *)local_2e00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2e00 + 8));
  myvk::ShaderModule::Create((ShaderModule *)local_2e00,device,kOctreeTracerBeamFragSpv,0x2b58);
  std::__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2> *)local_2e00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2e00 + 8));
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_2e00,
             vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,VK_SHADER_STAGE_VERTEX_BIT,(VkSpecializationInfo *)0x0);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)auStack_2dd0,
             frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,VK_SHADER_STAGE_FRAGMENT_BIT,(VkSpecializationInfo *)0x0);
  __l._M_len = 2;
  __l._M_array = (iterator)local_2e00;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector(&shader_stages,__l,(allocator_type *)local_2e60);
  local_2e00._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_2e00._8_8_ = (element_type *)0x0;
  local_2e00._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2de8 = (element_type *)0x0;
  _Stack_2de0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2dd8 = (VkSpecializationInfo *)0x0;
  auStack_2dd0._0_8_ = 0;
  auStack_2dd0._8_4_ = 0.0;
  local_2dc0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2dc0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2dc0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2dc0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2dc0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2dc0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2dc0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_2dc0.m_create_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_2dc0.m_enable = false;
  local_2dc0.m_create_info.pNext = (void *)0x0;
  local_2dc0.m_create_info.flags = 0;
  local_2dc0.m_create_info.vertexBindingDescriptionCount = 0;
  local_2dc0.m_create_info.pVertexBindingDescriptions._0_4_ = 0;
  local_2dc0.m_create_info._28_8_ = 0;
  local_2d58.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_2d58.m_enable = false;
  local_2d58.m_create_info.primitiveRestartEnable = 0;
  local_2d58.m_create_info.pNext = (void *)0x0;
  local_2d58.m_create_info.flags = 0;
  local_2d58.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_2d30 = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_2d18 = false;
  local_2d28 = (void *)0x0;
  uStack_2d20._0_4_ = 0;
  uStack_2d20._4_4_ = 0;
  local_2d10.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d10.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d10.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d10.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d10.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d10.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d10.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_2d10.m_create_info.pScissors = (VkRect2D *)0x0;
  local_2d10.m_enable = false;
  local_2d10.m_create_info.pNext = (void *)0x0;
  local_2d10.m_create_info.flags = 0;
  local_2d10.m_create_info.viewportCount = 0;
  local_2d10.m_create_info.pViewports._0_4_ = 0;
  local_2d10.m_create_info._28_8_ = 0;
  local_2ca8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_2ca8.m_create_info.alphaToCoverageEnable._0_1_ = 0;
  local_2ca8._41_8_ = 0;
  local_2ca8.m_create_info.sampleShadingEnable = 0;
  local_2ca8.m_create_info.minSampleShading = 0.0;
  local_2ca8.m_create_info.pSampleMask._0_1_ = 0;
  local_2ca8.m_create_info.pSampleMask._1_7_ = 0;
  local_2ca8.m_create_info.pNext = (void *)0x0;
  local_2ca8.m_create_info.flags = 0;
  local_2ca8.m_create_info.rasterizationSamples = 0;
  local_2c70 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_2c68 = (void *)0x0;
  uStack_2c60._0_4_ = 0;
  uStack_2c60._4_4_ = 0;
  local_2c58._0_4_ = 0;
  local_2c58._4_4_ = VK_COMPARE_OP_NEVER;
  uStack_2c50._0_4_ = 0;
  uStack_2c50._4_4_ = 0;
  local_2c48._0_4_ = VK_STENCIL_OP_KEEP;
  local_2c48._4_4_ = VK_STENCIL_OP_KEEP;
  local_2c48._8_4_ = VK_STENCIL_OP_KEEP;
  local_2c48._12_4_ = VK_COMPARE_OP_NEVER;
  local_2c48._16_4_ = 0;
  local_2c48._20_4_ = 0;
  local_2c48._24_4_ = 0;
  local_2c48._28_4_ = VK_STENCIL_OP_KEEP;
  local_2c28._0_4_ = VK_STENCIL_OP_KEEP;
  local_2c28._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_2c20._0_4_ = VK_COMPARE_OP_NEVER;
  uStack_2c20._4_4_ = 0;
  local_2c18._0_4_ = 0;
  local_2c18._4_4_ = 0;
  uStack_2c10._0_4_ = 0.0;
  uStack_2c10._4_4_ = 0.0;
  local_2c08 = false;
  local_2c00.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c00.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c00.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c00.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_2c00.m_enable = false;
  local_2c00.m_create_info.blendConstants[0] = 0.0;
  local_2c00.m_create_info.blendConstants[1] = 0.0;
  local_2c00.m_create_info.blendConstants[2] = 0.0;
  local_2c00.m_create_info.blendConstants[3] = 0.0;
  local_2c00.m_create_info.logicOp = VK_LOGIC_OP_CLEAR;
  local_2c00.m_create_info.attachmentCount = 0;
  local_2c00.m_create_info.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_2c00.m_create_info.pNext = (void *)0x0;
  local_2c00.m_create_info.flags = 0;
  local_2c00.m_create_info.logicOpEnable = 0;
  local_2ba8.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2ba8.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ba8.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ba8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_2ba8.m_create_info.pDynamicStates._0_1_ = 0;
  local_2ba8._49_8_ = 0;
  local_2ba8.m_create_info.pNext = (void *)0x0;
  local_2ba8.m_create_info.flags._0_1_ = 0;
  local_2ba8.m_create_info._17_7_ = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(&local_2dc0);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_2d58,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_2d10,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)local_2e00,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1
            );
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_2ca8,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable(&local_2c00,1,0);
  local_2e08[0] = VK_DYNAMIC_STATE_VIEWPORT;
  local_2e08[1] = VK_DYNAMIC_STATE_SCISSOR;
  __l_00._M_len = 2;
  __l_00._M_array = local_2e08;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_2e60,__l_00,
             &local_2e61);
  myvk::GraphicsPipelineState::DynamicState::Enable
            (&local_2ba8,(vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_2e60);
  std::_Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>::~_Vector_base
            ((_Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_2e60);
  myvk::GraphicsPipeline::Create
            ((GraphicsPipeline *)local_2e60,&this->m_beam_pipeline_layout,&this->m_beam_render_pass,
             &shader_stages,(GraphicsPipelineState *)local_2e00,0);
  std::__shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_beam_graphics_pipeline).
              super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2> *)local_2e60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2e60 + 8));
  myvk::GraphicsPipelineState::~GraphicsPipelineState((GraphicsPipelineState *)local_2e00);
  std::
  _Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~_Vector_base(&shader_stages.
                 super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void OctreeTracer::create_beam_graphics_pipeline(const std::shared_ptr<myvk::Device> &device) {
	constexpr uint32_t kOctreeTracerBeamFragSpv[] = {
#include "spirv/octree_tracer_beam.frag.u32"
	};
	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module = myvk::ShaderModule::Create(device, kOctreeTracerBeamFragSpv, sizeof(kOctreeTracerBeamFragSpv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_beam_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_beam_pipeline_layout, m_beam_render_pass, shader_stages, pipeline_state, 0);
}